

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

double __thiscall
double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  ushort *puVar1;
  ushort uVar2;
  uc16 uVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  byte bVar8;
  unsigned_short *puVar9;
  long lVar10;
  ushort *puVar11;
  bool bVar12;
  bool bVar13;
  char cVar14;
  bool bVar15;
  locale *plVar16;
  uint uVar17;
  long lVar18;
  unsigned_short *start_00;
  ulong uVar19;
  ushort *puVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ushort *puVar24;
  long in_FS_OFFSET;
  byte bVar25;
  bool sign;
  float fVar26;
  Vector<const_char> trimmed;
  Vector<const_char> trimmed_00;
  bool *in_stack_fffffffffffffc40;
  undefined8 local_3a8;
  int local_38c;
  int local_36c;
  char *start;
  bool result_is_junk_1;
  unsigned_short *end;
  undefined8 local_350;
  char buffer [782];
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  puVar20 = input + length;
  *processed_characters_count = 0;
  end = puVar20;
  local_350 = input;
  if (length == 0) {
LAB_003ed95c:
    local_3a8._0_4_ = SUB84(this->empty_string_value_,0);
    local_3a8._4_4_ = (uint)((ulong)this->empty_string_value_ >> 0x20);
  }
  else {
    uVar5 = this->flags_;
    local_350 = input;
    if ((uVar5 & 0x18) == 0) {
LAB_003ed82c:
      puVar11 = local_350;
      uVar2 = *local_350;
      if ((uVar2 == 0x2d) || (uVar2 == 0x2b)) {
        sign = uVar2 == 0x2d;
        puVar24 = local_350 + 1;
        lVar18 = 2;
        bVar12 = puVar24 != puVar20;
        if (bVar12) {
          puVar1 = local_350 + 1;
          in_stack_fffffffffffffc40 = (bool *)0x3ed87f;
          local_350 = puVar24;
          bVar13 = isWhitespace((uint)*puVar1);
          puVar24 = local_350;
          if (bVar13) {
            lVar10 = 4;
            do {
              lVar18 = lVar10;
              bVar13 = (ushort *)((long)puVar11 + lVar18) == puVar20;
              bVar12 = !bVar13;
              puVar24 = local_350;
              if (bVar13) break;
              in_stack_fffffffffffffc40 = (bool *)0x3ed8a2;
              bVar13 = isWhitespace((uint)*(ushort *)((long)puVar11 + lVar18));
              lVar10 = lVar18 + 2;
              puVar24 = local_350;
            } while (bVar13);
          }
        }
        local_350 = puVar24;
        if ((bVar12) && (lVar18 == 2 || (char)((uVar5 & 0x20) >> 5) != '\0')) {
          local_350 = (ushort *)((long)puVar11 + lVar18);
          bVar12 = true;
        }
        else {
          local_3a8 = this->junk_string_value_;
          bVar12 = false;
        }
        if (!bVar12) goto LAB_003edad1;
      }
      else {
        sign = false;
      }
      pcVar7 = this->infinity_symbol_;
      if (pcVar7 != (char *)0x0) {
        uVar2 = *local_350;
        if ((uVar5 & 0x40) == 0) {
          bVar12 = *pcVar7 == (char)uVar2;
        }
        else {
          if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
             (iVar21 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType),
             iVar21 != 0)) {
            plVar16 = (locale *)std::locale::classic();
            (anonymous_namespace)::ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar16);
            __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
          }
          in_stack_fffffffffffffc40 = (bool *)0x3ed93c;
          cVar14 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                             ((anonymous_namespace)::ToLower(char)::cType,(int)(char)uVar2);
          bVar12 = cVar14 == *pcVar7;
        }
        puVar9 = end;
        if (bVar12) {
          bVar12 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                             ((unsigned_short **)&local_350,end,this->infinity_symbol_,
                              SUB41((uVar5 & 0x40) >> 6,0));
          puVar20 = local_350;
          if ((bVar12) && (((uVar5 & 0x14) != 0 || (local_350 == puVar9)))) {
            if ((uVar5 & 4) == 0) {
              bVar12 = local_350 != puVar9;
              if ((bVar12) && (bVar13 = isWhitespace((uint)*local_350), bVar13)) {
                do {
                  puVar20 = puVar20 + 1;
                  bVar12 = puVar20 != puVar9;
                  if (puVar20 == puVar9) break;
                  bVar13 = isWhitespace((uint)*puVar20);
                } while (bVar13);
              }
              local_350 = puVar20;
              if (bVar12) goto LAB_003edede;
            }
            *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
            if (sign == false) {
              local_3a8._0_4_ = 0;
              local_3a8._4_4_ = 0x7ff00000;
            }
            else {
              local_3a8._0_4_ = 0;
              local_3a8._4_4_ = 0xfff00000;
            }
            goto LAB_003edacc;
          }
          goto LAB_003edac7;
        }
      }
      pcVar7 = this->nan_symbol_;
      if (pcVar7 != (char *)0x0) {
        uVar2 = *local_350;
        if ((uVar5 & 0x40) == 0) {
          bVar12 = *pcVar7 == (char)uVar2;
        }
        else {
          if (((anonymous_namespace)::ToLower(char)::cType == '\0') &&
             (iVar21 = __cxa_guard_acquire(&(anonymous_namespace)::ToLower(char)::cType),
             iVar21 != 0)) {
            plVar16 = (locale *)std::locale::classic();
            (anonymous_namespace)::ToLower(char)::cType = std::use_facet<std::ctype<char>>(plVar16);
            __cxa_guard_release(&(anonymous_namespace)::ToLower(char)::cType);
          }
          in_stack_fffffffffffffc40 = (bool *)0x3eda7c;
          cVar14 = (**(code **)(*(long *)(anonymous_namespace)::ToLower(char)::cType + 0x20))
                             ((anonymous_namespace)::ToLower(char)::cType,(int)(char)uVar2);
          bVar12 = cVar14 == *pcVar7;
        }
        puVar9 = end;
        if (bVar12) {
          bVar12 = (anonymous_namespace)::ConsumeSubString<unsigned_short_const*>
                             ((unsigned_short **)&local_350,end,this->nan_symbol_,
                              SUB41((uVar5 & 0x40) >> 6,0));
          puVar20 = local_350;
          if ((bVar12) && (((uVar5 & 0x14) != 0 || (local_350 == puVar9)))) {
            if ((uVar5 & 4) == 0) {
              bVar12 = local_350 != puVar9;
              if ((bVar12) && (bVar13 = isWhitespace((uint)*local_350), bVar13)) {
                do {
                  puVar20 = puVar20 + 1;
                  bVar12 = puVar20 != puVar9;
                  if (puVar20 == puVar9) break;
                  bVar13 = isWhitespace((uint)*puVar20);
                } while (bVar13);
              }
              local_350 = puVar20;
              if (bVar12) goto LAB_003edede;
            }
            *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
            if (sign == false) {
              local_3a8._0_4_ = 0;
              local_3a8._4_4_ = 0x7ff80000;
            }
            else {
              local_3a8._0_4_ = 0;
              local_3a8._4_4_ = 0xfff80000;
            }
            goto LAB_003edacc;
          }
          goto LAB_003edac7;
        }
      }
      uVar2 = *local_350;
      local_38c = 0;
      bVar25 = 0;
      if (uVar2 != 0x30) {
LAB_003edb21:
        uVar3 = this->separator_;
        bVar12 = false;
        local_36c = 0;
        iVar23 = 0;
        iVar21 = 0;
        do {
          uVar4 = *local_350;
          if (9 < (ushort)(uVar4 - 0x30)) {
            if (iVar23 == 0) {
              bVar25 = 0;
            }
            iVar21 = 0;
            if (uVar4 != 0x2e) goto LAB_003ee096;
            if (((~bVar25 | (byte)uVar5 >> 2) & 1) == 0) {
              local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
              local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
              goto LAB_003edacc;
            }
            if ((bVar25 & 1) == 0) {
              uVar3 = this->separator_;
              in_stack_fffffffffffffc40 = (bool *)0x3edeb9;
              bVar13 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,uVar3,10,&end);
              iVar22 = 0;
              iVar21 = 0;
              if (!bVar13) {
                if ((iVar23 != 0) || (*local_350 != 0x30)) goto LAB_003ee02d;
                iVar22 = 0;
                goto LAB_003ee005;
              }
              puVar20 = local_350;
              if ((iVar23 == 0) && (uVar2 != 0x30)) goto LAB_003edede;
            }
            else {
              iVar21 = 0;
              puVar20 = local_350;
            }
            break;
          }
          if (iVar23 < 0x304) {
            lVar18 = (long)local_38c;
            local_38c = local_38c + 1;
            buffer[lVar18] = (char)uVar4;
            iVar23 = iVar23 + 1;
          }
          else {
            local_36c = local_36c + 1;
            bVar12 = (bool)(uVar4 != 0x30 | bVar12);
          }
          bVar8 = bVar25 & 1;
          bVar25 = false;
          if (bVar8 != 0) {
            bVar25 = *local_350 < 0x38;
          }
          in_stack_fffffffffffffc40 = (bool *)0x3edbbf;
          bVar13 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,uVar3,10,&end);
          puVar20 = local_350;
        } while (!bVar13);
        goto LAB_003edbc3;
      }
      uVar3 = this->separator_;
      in_stack_fffffffffffffc40 = (bool *)0x3edc5a;
      bVar12 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,uVar3,10,&end);
      puVar9 = end;
      if (!bVar12) {
        bVar25 = (byte)this->flags_;
        if (((this->flags_ & 0x81U) != 0) && ((*local_350 | 0x20) == 0x78)) {
          start_00 = local_350 + 1;
          local_350 = start_00;
          if (start_00 != end) {
            if ((char)bVar25 < '\0') {
              bVar12 = IsHexFloatString<unsigned_short_const*>
                                 (start_00,end,uVar3,SUB41((uVar5 & 4) >> 2,0));
            }
            else {
              bVar12 = false;
            }
            if (((bVar12 != false) || (uVar2 = *start_00, uVar2 < 0x40 && uVar2 - 0x30 < 10)) ||
               ((uVar17 = uVar2 - 0x41, uVar17 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar17 & 0x3f) & 1) != 0)))) {
              buffer[0] = -0x56;
              local_3a8 = RadixStringToIeee<4,unsigned_short_const*>
                                    ((unsigned_short **)&local_350,puVar9,sign,uVar3,bVar12,
                                     SUB41((uVar5 & 4) >> 2,0),this->junk_string_value_,
                                     read_as_double,(bool *)buffer);
              puVar20 = local_350;
              if (buffer[0] == '\0') {
                if ((local_350 != puVar9 && (uVar5 & 0x10) != 0) &&
                   (bVar12 = isWhitespace((uint)*local_350), bVar12)) {
                  do {
                    puVar20 = puVar20 + 1;
                    if (puVar20 == puVar9) break;
                    bVar12 = isWhitespace((uint)*puVar20);
                  } while (bVar12);
                }
                local_350 = puVar20;
                *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
              }
              goto LAB_003edad1;
            }
          }
          goto LAB_003edede;
        }
        do {
          if (*local_350 != 0x30) {
            bVar25 = bVar25 >> 1;
            goto LAB_003edb21;
          }
          in_stack_fffffffffffffc40 = (bool *)0x3edd23;
          bVar12 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,uVar3,10,&end);
        } while (!bVar12);
      }
LAB_003edc5e:
      *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
      if (sign == false) {
        local_3a8._0_4_ = 0;
        local_3a8._4_4_ = 0;
      }
      else {
        local_3a8._0_4_ = 0;
        local_3a8._4_4_ = 0x80000000;
      }
    }
    else {
      in_stack_fffffffffffffc40 = (bool *)0x3ed7c7;
      bVar12 = isWhitespace((uint)*input);
      if (bVar12) {
        lVar18 = (long)length * 2;
        puVar11 = input + 1;
        do {
          puVar24 = puVar11;
          lVar18 = lVar18 + -2;
          if (lVar18 == 0) goto LAB_003ed94d;
          in_stack_fffffffffffffc40 = (bool *)0x3ed7f4;
          bVar12 = isWhitespace((uint)*puVar24);
          puVar11 = puVar24 + 1;
        } while (bVar12);
        local_350 = puVar24;
        if (lVar18 == 0) {
LAB_003ed94d:
          *processed_characters_count = (int)((ulong)((long)puVar24 - (long)input) >> 1);
          local_350 = puVar24;
          goto LAB_003ed95c;
        }
      }
      if (((uVar5 & 8) != 0) || (local_350 == input)) goto LAB_003ed82c;
LAB_003edac7:
      local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
      local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
    }
  }
  goto LAB_003edacc;
LAB_003ee096:
  puVar20 = local_350;
  puVar9 = end;
  if ((iVar23 != 0 || iVar21 != 0) || uVar2 == 0x30) {
    if ((*local_350 | 0x20) == 0x65) {
      if (((~bVar25 | (byte)uVar5 >> 2) & 1) == 0) goto LAB_003ee22f;
      if ((bVar25 & 1) != 0) goto LAB_003edbc3;
      puVar11 = local_350 + 1;
      if (puVar11 == end) {
LAB_003ee13d:
        local_350 = puVar11;
        if ((uVar5 & 4) == 0) {
          local_3a8 = this->junk_string_value_;
          iVar23 = 1;
        }
        else {
          iVar23 = 6;
          local_350 = puVar20;
        }
      }
      else {
        uVar2 = *puVar11;
        if ((uVar2 == 0x2d) || (cVar14 = '+', uVar2 == 0x2b)) {
          puVar11 = local_350 + 2;
          cVar14 = (char)uVar2;
          if (puVar11 == end) goto LAB_003ee13d;
        }
        local_350 = puVar11;
        puVar11 = local_350;
        if ((local_350 == end) || ((ushort)(*local_350 - 0x3a) < 0xfff6)) goto LAB_003ee13d;
        iVar23 = 0;
        puVar20 = local_350;
        do {
          local_350 = puVar20 + 1;
          if ((iVar23 < 0x6666666) ||
             ((iVar22 = 0x3fffffff, iVar23 == 0x6666666 && (*puVar20 < 0x34)))) {
            iVar22 = (uint)*puVar20 + iVar23 * 10 + -0x30;
          }
          iVar23 = iVar22;
        } while ((local_350 != end) && (puVar20 = local_350, (ushort)(*local_350 - 0x30) < 10));
        iVar22 = -iVar23;
        if (cVar14 != '-') {
          iVar22 = iVar23;
        }
        iVar21 = iVar21 + iVar22;
        iVar23 = 0;
      }
      puVar20 = local_350;
      if (iVar23 == 6) goto LAB_003edbc3;
      if (iVar23 != 0) goto LAB_003edad1;
    }
    puVar20 = local_350;
    if (((uVar5 & 0x14) != 0) || (local_350 == end)) {
      if ((uVar5 & 4) != 0) {
LAB_003ee1c8:
        puVar20 = local_350;
        puVar9 = end;
        if (((uVar5 & 0x10) != 0) && (local_350 != end)) {
          in_stack_fffffffffffffc40 = (bool *)0x3ee1f4;
          bVar13 = isWhitespace((uint)*local_350);
          if (bVar13) {
            do {
              puVar20 = puVar20 + 1;
              if (puVar20 == puVar9) break;
              in_stack_fffffffffffffc40 = (bool *)0x3ee20d;
              bVar13 = isWhitespace((uint)*puVar20);
            } while (bVar13);
          }
        }
        goto LAB_003edbc3;
      }
      bVar13 = local_350 != end;
      if (bVar13) {
        in_stack_fffffffffffffc40 = (bool *)0x3ee18b;
        bVar15 = isWhitespace((uint)*local_350);
        if (bVar15) {
          do {
            puVar20 = puVar20 + 1;
            bVar13 = puVar20 != puVar9;
            if (puVar20 == puVar9) break;
            in_stack_fffffffffffffc40 = (bool *)0x3ee1a8;
            bVar15 = isWhitespace((uint)*puVar20);
          } while (bVar15);
        }
      }
      local_350 = puVar20;
      if (!bVar13) goto LAB_003ee1c8;
LAB_003edede:
      local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
      local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
      goto LAB_003edacc;
    }
  }
LAB_003ee22f:
  local_3a8._0_4_ = SUB84(this->junk_string_value_,0);
  local_3a8._4_4_ = (uint)((ulong)this->junk_string_value_ >> 0x20);
  goto LAB_003edacc;
  while (iVar22 = iVar22 + -1, *local_350 == 0x30) {
LAB_003ee005:
    in_stack_fffffffffffffc40 = (bool *)0x3ee017;
    bVar13 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,uVar3,10,&end);
    if (bVar13) goto LAB_003edc5e;
  }
LAB_003ee02d:
  iVar21 = iVar22;
  do {
    uVar4 = *local_350;
    if (9 < (ushort)(uVar4 - 0x30)) goto LAB_003ee096;
    if (iVar23 < 0x304) {
      lVar18 = (long)local_38c;
      local_38c = local_38c + 1;
      buffer[lVar18] = (char)uVar4;
      iVar23 = iVar23 + 1;
      iVar21 = iVar21 + -1;
    }
    else {
      bVar12 = (bool)(uVar4 != 0x30 | bVar12);
    }
    in_stack_fffffffffffffc40 = (bool *)0x3ee08d;
    bVar13 = Advance<unsigned_short_const*>((unsigned_short **)&local_350,uVar3,10,&end);
    puVar20 = local_350;
  } while (!bVar13);
LAB_003edbc3:
  local_350 = puVar20;
  if ((bVar25 & 1) != 0) {
    result_is_junk_1 = true;
    start = buffer;
    local_3a8 = RadixStringToIeee<3,char*>
                          (&start,buffer + local_38c,sign,this->separator_,SUB41((uVar5 & 4) >> 2,0)
                           ,read_as_double,this->junk_string_value_,SUB81(&result_is_junk_1,0),
                           in_stack_fffffffffffffc40);
    *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
    goto LAB_003edad1;
  }
  iVar21 = iVar21 + local_36c;
  if (bVar12) {
    lVar18 = (long)local_38c;
    local_38c = local_38c + 1;
    buffer[lVar18] = '1';
    iVar21 = iVar21 + -1;
  }
  lVar18 = (long)local_38c;
  buffer[lVar18] = '\0';
  uVar19 = (ulong)(local_38c + 1);
  do {
    if (lVar18 < 1) {
      uVar19 = 0;
      break;
    }
    uVar19 = (ulong)((int)uVar19 - 1);
    lVar10 = lVar18 + -1;
    lVar18 = lVar18 + -1;
  } while (buffer[lVar10] == '0');
  iVar21 = (local_38c - (int)uVar19) + iVar21;
  if (read_as_double) {
    trimmed._8_8_ = uVar19;
    trimmed.start_ = buffer;
    local_3a8 = StrtodTrimmed(trimmed,iVar21);
  }
  else {
    trimmed_00._8_8_ = uVar19;
    trimmed_00.start_ = buffer;
    fVar26 = StrtofTrimmed(trimmed_00,iVar21);
    local_3a8 = (double)fVar26;
  }
  *processed_characters_count = (int)((ulong)((long)local_350 - (long)input) >> 1);
  if (sign == false) goto LAB_003edad1;
  local_3a8._4_4_ = (uint)((ulong)local_3a8 >> 0x20);
  local_3a8._4_4_ = local_3a8._4_4_ ^ 0x80000000;
LAB_003edacc:
LAB_003edad1:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return local_3a8;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;
  const bool allow_case_insensitivity = (flags_ & ALLOW_CASE_INSENSITIVITY) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, infinity_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, infinity_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != DOUBLE_CONVERSION_NULLPTR) {
    if (ConsumeFirstCharacter(*current, nan_symbol_, allow_case_insensitivity)) {
      if (!ConsumeSubString(&current, end, nan_symbol_, allow_case_insensitivity)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    if (Advance(&current, separator_, 10, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if (((flags_ & ALLOW_HEX) || (flags_ & ALLOW_HEX_FLOATS)) &&
        (*current == 'x' || *current == 'X')) {
      ++current;

      if (current == end) return junk_string_value_;  // "0x"

      bool parse_as_hex_float = (flags_ & ALLOW_HEX_FLOATS) &&
                IsHexFloatString(current, end, separator_, allow_trailing_junk);

      if (!parse_as_hex_float && !isDigit(*current, 16)) {
        return junk_string_value_;
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           separator_,
                                           parse_as_hex_float,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      if (Advance(&current, separator_, 10, end)) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  DOUBLE_CONVERSION_STACK_UNINITIALIZED char
      buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    if (Advance(&current, separator_, 10, end)) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    if (Advance(&current, separator_, 10, end)) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        if (Advance(&current, separator_, 10, end)) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      if (Advance(&current, separator_, 10, end)) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    Iterator junk_begin = current;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          current = junk_begin;
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        current = junk_begin;
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    DOUBLE_CONVERSION_ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  separator_,
                                  false, // Don't parse as hex_float.
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    DOUBLE_CONVERSION_ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  DOUBLE_CONVERSION_ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  // Code above ensures there are no leading zeros and the buffer has fewer than
  // kMaxSignificantDecimalDigits characters. Trim trailing zeros.
  Vector<const char> chars(buffer, buffer_pos);
  chars = TrimTrailingZeros(chars);
  exponent += buffer_pos - chars.length();

  double converted;
  if (read_as_double) {
    converted = StrtodTrimmed(chars, exponent);
  } else {
    converted = StrtofTrimmed(chars, exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}